

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage9.cpp
# Opt level: O1

void test(bool verbose)

{
  atomic_llong aVar1;
  atomic_llong aVar2;
  atomic_llong aVar3;
  atomic_llong aVar4;
  memory_resource *pmVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  long lVar8;
  __atomic_base<int> _Var9;
  pstring astring;
  Framer framer;
  pstring mstring;
  test_resource tr;
  test_resource dr;
  Framer local_230;
  test_resource *local_228;
  long local_220;
  undefined8 *puStack_218;
  test_resource local_210;
  test_resource local_120;
  
  Framer::Framer(&local_230,"Monitoring",verbose);
  std::pmr::test_resource::test_resource(&local_120,"default");
  aVar4.super___atomic_base<long_long>._M_i =
       local_120.m_total_blocks_.super___atomic_base<long_long>._M_i;
  aVar3.super___atomic_base<long_long>._M_i =
       local_120.m_blocks_in_use_.super___atomic_base<long_long>._M_i;
  pmVar5 = (memory_resource *)std::pmr::set_default_resource(&local_120.super_memory_resource);
  _Var9._M_i._1_3_ = 0;
  _Var9._M_i._0_1_ = verbose;
  local_120.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var9._M_i;
  std::pmr::test_resource::test_resource(&local_210,"object");
  aVar2.super___atomic_base<long_long>._M_i =
       local_210.m_total_blocks_.super___atomic_base<long_long>._M_i;
  aVar1.super___atomic_base<long_long>._M_i =
       local_210.m_blocks_in_use_.super___atomic_base<long_long>._M_i;
  local_210.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var9._M_i;
  puVar6 = (undefined8 *)(**(code **)(local_210._0_8_ + 0x10))(&local_210,8,1);
  *puVar6 = 0x6c6f6f66726162;
  if (local_210.m_total_blocks_.super___atomic_base<long_long>._M_i ==
      aVar2.super___atomic_base<long_long>._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"trm.is_total_up()",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  if ((long)local_210.m_blocks_in_use_.super___atomic_base<long_long>._M_i -
      (long)aVar1.super___atomic_base<long_long>._M_i != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"trm.delta_blocks_in_use()",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1",1);
    local_228._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_228,1);
    poVar7 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," != ",4);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,1);
    local_228 = (test_resource *)CONCAT71(local_228._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_228,1);
  }
  local_220 = 7;
  local_228 = &local_210;
  puStack_218 = puVar6;
  if (local_120.m_blocks_in_use_.super___atomic_base<long_long>._M_i !=
      aVar3.super___atomic_base<long_long>._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"drm.is_in_use_same()",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  if (local_120.m_total_blocks_.super___atomic_base<long_long>._M_i !=
      aVar4.super___atomic_base<long_long>._M_i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"drm.is_total_same()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != true\n",9);
  }
  lVar8 = local_220 + 1;
  if (local_220 == 0) {
    lVar8 = 0;
  }
  (**(code **)(*(long *)local_228 + 0x18))(local_228,puStack_218,lVar8,1);
  (**(code **)(local_210._0_8_ + 0x18))(&local_210,0,0,1);
  std::pmr::test_resource::~test_resource(&local_210);
  std::pmr::set_default_resource(pmVar5);
  std::pmr::test_resource::~test_resource(&local_120);
  Framer::~Framer(&local_230);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Monitoring", verbose };

    std::pmr::test_resource           dr{ "default" };
    std::pmr::test_resource_monitor  drm{ dr };
    std::pmr::default_resource_guard drg{ &dr };
    dr.set_verbose(verbose);

    std::pmr::test_resource          tr{ "object" };
    std::pmr::test_resource_monitor trm{ tr };
    tr.set_verbose(verbose);

    pstring astring{ "barfool", &tr };
    ASSERT(trm.is_total_up());
    ASSERT_EQ(trm.delta_blocks_in_use(), 1);
    trm.reset();

    pstring mstring{ std::move(astring) };

    ASSERT(drm.is_in_use_same()); // Did not allocate`bstring` with this
    ASSERT(drm.is_total_same());  // Did not allocate /anything/ with this
}